

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_eq<pugi::impl::(anonymous_namespace)::equal_to>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               equal_to *comp)

{
  bool bVar1;
  xpath_allocator *na;
  xpath_allocator *alloc;
  xpath_node *pxVar2;
  xpath_node *pxVar3;
  xpath_node *pxVar4;
  undefined8 *in_RCX;
  xpath_ast_node *in_RSI;
  xpath_ast_node *in_RDI;
  equal_to *in_R8;
  xpath_allocator_capture cri_2;
  xpath_node *ri_2;
  xpath_node_set_raw rs_3;
  xpath_string l_1;
  xpath_allocator_capture cr_3;
  xpath_allocator_capture cri_1;
  xpath_node *ri_1;
  xpath_node_set_raw rs_2;
  double l;
  xpath_allocator_capture cr_2;
  xpath_allocator_capture cri;
  xpath_node *ri;
  xpath_node *li;
  xpath_node_set_raw rs_1;
  xpath_node_set_raw ls_1;
  xpath_allocator_capture cr_1;
  xpath_string rs;
  xpath_string ls;
  xpath_allocator_capture cr;
  xpath_value_type rt;
  xpath_value_type lt;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  equal_to *in_stack_fffffffffffffca0;
  equal_to *peVar5;
  xpath_allocator *in_stack_fffffffffffffd38;
  xpath_node *in_stack_fffffffffffffd40;
  xpath_allocator_capture local_288;
  undefined8 in_stack_fffffffffffffd98;
  nodeset_eval_t eval;
  xpath_stack *in_stack_fffffffffffffda0;
  xpath_context *in_stack_fffffffffffffda8;
  xpath_ast_node *in_stack_fffffffffffffdb0;
  xpath_allocator_capture local_228;
  xpath_string local_208;
  double local_1f0;
  xpath_allocator_capture local_1e8;
  xpath_node *local_1c8;
  xpath_node_set_raw local_1c0;
  double local_1a0;
  xpath_allocator_capture local_198;
  bool local_176;
  bool local_175;
  uint local_174;
  xpath_stack *in_stack_fffffffffffffed8;
  xpath_context *in_stack_fffffffffffffee0;
  xpath_ast_node *in_stack_fffffffffffffee8;
  xpath_allocator *pxVar6;
  xpath_allocator *pxVar7;
  xpath_node_set_raw local_110;
  xpath_node_set_raw local_f0;
  xpath_allocator_capture local_d0;
  xpath_stack *in_stack_ffffffffffffff58;
  xpath_context *in_stack_ffffffffffffff60;
  xpath_ast_node *in_stack_ffffffffffffff68;
  xpath_allocator_capture local_70;
  double local_50;
  double local_48;
  bool local_3a;
  bool local_39;
  xpath_value_type local_38;
  xpath_value_type local_34;
  equal_to *local_30;
  undefined8 *local_28;
  xpath_ast_node *local_18;
  xpath_ast_node *local_10;
  byte local_1;
  
  eval = (nodeset_eval_t)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_34 = rettype(in_RDI);
  local_38 = rettype(local_18);
  if ((local_34 == xpath_type_node_set) || (local_38 == xpath_type_node_set)) {
    if ((local_34 == xpath_type_node_set) && (local_38 == xpath_type_node_set)) {
      xpath_allocator_capture::xpath_allocator_capture(&local_d0,(xpath_allocator *)*local_28);
      eval_node_set(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    eval);
      eval_node_set(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    eval);
      na = (xpath_allocator *)xpath_node_set_raw::begin(&local_f0);
      pxVar6 = na;
      while (pxVar7 = pxVar6, alloc = (xpath_allocator *)xpath_node_set_raw::end(&local_f0),
            pxVar6 != alloc) {
        pxVar2 = xpath_node_set_raw::begin(&local_110);
        while (pxVar4 = pxVar2, pxVar3 = xpath_node_set_raw::end(&local_110), pxVar2 != pxVar3) {
          xpath_allocator_capture::xpath_allocator_capture
                    ((xpath_allocator_capture *)&stack0xfffffffffffffec0,
                     (xpath_allocator *)*local_28);
          string_value((xpath_node *)na,alloc);
          string_value((xpath_node *)na,alloc);
          bVar1 = (anonymous_namespace)::equal_to::operator()
                            (in_stack_fffffffffffffca0,
                             (xpath_string *)
                             CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                             (xpath_string *)0x163ff1);
          if (bVar1) {
            local_1 = 1;
          }
          local_174 = (uint)bVar1;
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x16406d);
          if (local_174 != 0) goto LAB_001640c3;
          pxVar2 = pxVar4 + 1;
        }
        pxVar6 = (xpath_allocator *)&pxVar7->_error;
      }
      local_1 = 0;
      local_174 = 1;
LAB_001640c3:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1640d0);
      goto LAB_00164604;
    }
    if (local_34 == xpath_type_node_set) {
      (anonymous_namespace)::swap<pugi::impl::(anonymous_namespace)::xpath_ast_node*>
                (&local_10,&local_18);
      swap<pugi::xpath_value_type>(&local_34,&local_38);
    }
    if (local_34 == xpath_type_boolean) {
      local_175 = eval_boolean(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffed8);
      local_176 = eval_boolean(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffed8);
      local_1 = (anonymous_namespace)::equal_to::operator()(local_30,&local_175,&local_176);
      goto LAB_00164604;
    }
    if (local_34 == xpath_type_number) {
      xpath_allocator_capture::xpath_allocator_capture(&local_198,(xpath_allocator *)*local_28);
      local_1a0 = eval_number(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58);
      eval_node_set(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    eval);
      for (local_1c8 = xpath_node_set_raw::begin(&local_1c0); pxVar2 = local_1c8,
          pxVar4 = xpath_node_set_raw::end(&local_1c0), pxVar2 != pxVar4; local_1c8 = local_1c8 + 1)
      {
        xpath_allocator_capture::xpath_allocator_capture(&local_1e8,(xpath_allocator *)*local_28);
        peVar5 = local_30;
        string_value(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        xpath_string::c_str(&local_208);
        local_1f0 = convert_string_to_number
                              ((char_t *)
                               CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
        bVar1 = (anonymous_namespace)::equal_to::operator()(peVar5,&local_1a0,&local_1f0);
        if (bVar1) {
          local_1 = 1;
        }
        local_174 = (uint)bVar1;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x164394);
        if (local_174 != 0) goto LAB_001643cf;
      }
      local_1 = 0;
      local_174 = 1;
LAB_001643cf:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1643dc);
      goto LAB_00164604;
    }
    if (local_34 == xpath_type_string) {
      xpath_allocator_capture::xpath_allocator_capture(&local_228,(xpath_allocator *)*local_28);
      eval_string((xpath_ast_node *)cr_1._state._root,(xpath_context *)cr_1._target,
                  (xpath_stack *)ls_1._eos);
      eval_node_set(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                    eval);
      pxVar2 = xpath_node_set_raw::begin((xpath_node_set_raw *)&stack0xfffffffffffffda0);
      while (pxVar4 = pxVar2,
            pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&stack0xfffffffffffffda0),
            pxVar2 != pxVar3) {
        xpath_allocator_capture::xpath_allocator_capture(&local_288,(xpath_allocator *)*local_28);
        peVar5 = local_30;
        string_value(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        in_stack_fffffffffffffc9f =
             (anonymous_namespace)::equal_to::operator()
                       (peVar5,(xpath_string *)
                               CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                        (xpath_string *)0x164522);
        if ((bool)in_stack_fffffffffffffc9f) {
          local_1 = 1;
        }
        local_174 = (uint)(byte)in_stack_fffffffffffffc9f;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x16459b);
        if (local_174 != 0) goto LAB_001645d6;
        pxVar2 = pxVar4 + 1;
      }
      local_1 = 0;
      local_174 = 1;
LAB_001645d6:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x1645e3);
      goto LAB_00164604;
    }
  }
  else {
    if ((local_34 == xpath_type_boolean) || (local_38 == xpath_type_boolean)) {
      local_39 = eval_boolean(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed8);
      local_3a = eval_boolean(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed8);
      local_1 = (anonymous_namespace)::equal_to::operator()(local_30,&local_39,&local_3a);
      goto LAB_00164604;
    }
    if ((local_34 == xpath_type_number) || (local_38 == xpath_type_number)) {
      local_48 = eval_number(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58);
      local_50 = eval_number(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58);
      local_1 = (anonymous_namespace)::equal_to::operator()(local_30,&local_48,&local_50);
      goto LAB_00164604;
    }
    if ((local_34 == xpath_type_string) || (local_38 == xpath_type_string)) {
      xpath_allocator_capture::xpath_allocator_capture(&local_70,(xpath_allocator *)*local_28);
      eval_string((xpath_ast_node *)cr_1._state._root,(xpath_context *)cr_1._target,
                  (xpath_stack *)ls_1._eos);
      eval_string((xpath_ast_node *)cr_1._state._root,(xpath_context *)cr_1._target,
                  (xpath_stack *)ls_1._eos);
      local_1 = (anonymous_namespace)::equal_to::operator()
                          (in_stack_fffffffffffffca0,
                           (xpath_string *)
                           CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                           (xpath_string *)0x163dbc);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)0x163de2);
      goto LAB_00164604;
    }
  }
  local_1 = 0;
LAB_00164604:
  return (bool)(local_1 & 1);
}

Assistant:

static bool compare_eq(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
			{
				if (lt == xpath_type_boolean || rt == xpath_type_boolean)
					return comp(lhs->eval_boolean(c, stack), rhs->eval_boolean(c, stack));
				else if (lt == xpath_type_number || rt == xpath_type_number)
					return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
				else if (lt == xpath_type_string || rt == xpath_type_string)
				{
					xpath_allocator_capture cr(stack.result);

					xpath_string ls = lhs->eval_string(c, stack);
					xpath_string rs = rhs->eval_string(c, stack);

					return comp(ls, rs);
				}
			}
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture cri(stack.result);

						if (comp(string_value(*li, stack.result), string_value(*ri, stack.result)))
							return true;
					}

				return false;
			}
			else
			{
				if (lt == xpath_type_node_set)
				{
					swap(lhs, rhs);
					swap(lt, rt);
				}

				if (lt == xpath_type_boolean)
					return comp(lhs->eval_boolean(c, stack), rhs->eval_boolean(c, stack));
				else if (lt == xpath_type_number)
				{
					xpath_allocator_capture cr(stack.result);

					double l = lhs->eval_number(c, stack);
					xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture cri(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}

					return false;
				}
				else if (lt == xpath_type_string)
				{
					xpath_allocator_capture cr(stack.result);

					xpath_string l = lhs->eval_string(c, stack);
					xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture cri(stack.result);

						if (comp(l, string_value(*ri, stack.result)))
							return true;
					}

					return false;
				}
			}

			assert(false && "Wrong types"); // unreachable
			return false;
		}